

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.h
# Opt level: O0

void testing::internal::
     PrintWithFallback<std::basic_string_view<unsigned_char,std::char_traits<unsigned_char>>>
               (basic_string_view<unsigned_char,_std::char_traits<unsigned_char>_> *value,
               ostream *os)

{
  ostream *os_local;
  basic_string_view<unsigned_char,_std::char_traits<unsigned_char>_> *value_local;
  
  ContainerPrinter::
  PrintValue<std::basic_string_view<unsigned_char,std::char_traits<unsigned_char>>,void>(value,os);
  return;
}

Assistant:

void PrintWithFallback(const T& value, ::std::ostream* os) {
  using Printer = typename FindFirstPrinter<
      T, void, ContainerPrinter, FunctionPointerPrinter, PointerPrinter,
      internal_stream_operator_without_lexical_name_lookup::StreamPrinter,
      ProtobufPrinter, ConvertibleToIntegerPrinter,
      ConvertibleToStringViewPrinter, RawBytesPrinter, FallbackPrinter>::type;
  Printer::PrintValue(value, os);
}